

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<double>::Decompose_LDLt
          (TPZSkylMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  char cVar1;
  double **ppdVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double extraout_XMM0_Qa;
  long local_50;
  long local_48;
  long local_40;
  value_type_conflict5 local_38;
  
  cVar1 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar1 != '\0') {
    if (cVar1 == '\x04') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Decompose_LDLt(std::list<int64_t> &) [TVar = double]"
               ,"Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(singular);
  iVar3 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  local_48 = CONCAT44(extraout_var,iVar3);
  lVar9 = 2;
  lVar11 = 8;
  for (lVar10 = 1; lVar10 < local_48; lVar10 = lVar10 + 1) {
    ppdVar2 = (this->fElem).fStore;
    lVar4 = (long)ppdVar2[lVar10 + 1] - (long)ppdVar2[lVar10] >> 3;
    lVar7 = (lVar10 - lVar4) + 1;
    lVar4 = lVar9 - lVar4;
    lVar8 = lVar7;
    local_40 = lVar9;
    while (local_50 = lVar8, local_50 <= lVar10) {
      ppdVar2 = (this->fElem).fStore;
      lVar12 = (local_50 - ((long)ppdVar2[local_50 + 1] - (long)ppdVar2[local_50] >> 3)) + 1;
      lVar9 = lVar12;
      if (lVar12 < lVar7) {
        lVar9 = lVar7;
      }
      pdVar5 = ppdVar2[local_50] + local_50;
      lVar8 = lVar4;
      if (lVar4 < lVar12) {
        lVar8 = lVar12;
      }
      pdVar6 = (double *)((long)ppdVar2[lVar10] + lVar11);
      dVar13 = 0.0;
      for (; lVar9 < local_50; lVar9 = lVar9 + 1) {
        dVar13 = dVar13 + pdVar6[-lVar8] * pdVar5[-lVar8] * *ppdVar2[lVar9];
        pdVar5 = pdVar5 + -1;
        pdVar6 = pdVar6 + -1;
      }
      if (lVar12 <= lVar4) {
        lVar12 = lVar4;
      }
      dVar13 = pdVar6[-lVar12] - dVar13;
      pdVar6[-lVar12] = dVar13;
      lVar8 = local_50 + 1;
      if (pdVar6 == pdVar5) {
        if (ABS(dVar13) < 1e-12) {
          std::__cxx11::list<long,_std::allocator<long>_>::push_back(singular,&local_50);
          pdVar6[-lVar12] = 1.0;
          lVar8 = local_50 + 1;
        }
      }
      else {
        pdVar6[-lVar12] = dVar13 / pdVar5[-lVar12];
      }
    }
    lVar9 = local_40 + 1;
    lVar11 = lVar11 + 8;
  }
  lVar10 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar10 != 0) &&
     ((*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (this,lVar10 + -1), ABS(extraout_XMM0_Qa) < 1e-12)) {
    local_38 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + -1;
    std::__cxx11::list<long,_std::allocator<long>_>::push_back(singular,&local_38);
    lVar10 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + -1;
    local_38 = 0x3ff0000000000000;
    (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
              (this,lVar10,lVar10,&local_38);
  }
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt(std::list<int64_t> &singular)
{
    if( this->fDecomposed == ELDLt) return 1;
    if ( this->fDecomposed )
    {
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    }
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt(singular)");
#endif
    
    singular.clear();
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TVar sum;
    j = 1;
    while(j < dimension) {
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            sum = 0.;
            //EBORIN: 
            // Is this a hot spot?
            while(k < l) {
                sum += *elj-- * *ell-- * *(fElem[k++]);
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
                singular.push_back(l);
                *elj = 1.;
            }
            l++;
        }
        j++;
    }
    
    if(this->Rows() && IsZero(GetVal(this->Rows()-1,this->Rows()-1)))
    {
        singular.push_back(this->Rows()-1);
        PutVal(this->Rows()-1,this->Rows()-1,1.);
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}